

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CEseqFloatVisitor::processSourceEseqInCMove
          (CEseqFloatVisitor *this,CExpression *target,CEseqExpression *sourceEseq)

{
  code *pcVar1;
  CEseqExpression *exp;
  bool bVar2;
  CExpression *pCVar3;
  CStatement *pCVar4;
  CSeqStatement *pCVar5;
  CMoveStatement *pCVar6;
  CTempExpression *pCVar7;
  CSeqStatement *this_00;
  CMemExpression *this_01;
  CEseqExpression *in_RCX;
  long local_240;
  CMemExpression *local_230;
  long local_1e0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1b8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1b0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1a8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1a0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_198;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_190;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_188;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_180;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_178;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_168;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_160;
  undefined1 local_151;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_150;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_148;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_140;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_138;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_130;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_128;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_120;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_118;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_110;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_108;
  undefined1 local_f9;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_f8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_f0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_e8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_e0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c8;
  undefined1 local_c0 [8];
  CTemp temp;
  CTempExpression *tempTarget;
  CMemExpression *memTarget;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_88;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_68;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_60 [3];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_48;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_40;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_38;
  long local_30;
  CEseqExpression *eseq;
  CEseqExpression *sourceEseq_local;
  CExpression *target_local;
  CEseqFloatVisitor *this_local;
  
  eseq = in_RCX;
  sourceEseq_local = sourceEseq;
  target_local = target;
  this_local = this;
  pCVar3 = CEseqExpression::getExpression(in_RCX);
  if (pCVar3 == (CExpression *)0x0) {
    local_1e0 = 0;
  }
  else {
    local_1e0 = __dynamic_cast(pCVar3,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  exp = sourceEseq_local;
  local_30 = local_1e0;
  if (local_1e0 != 0) {
    __assert_fail("eseq == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CEseqFloatVisitor.cpp"
                  ,0x11c,
                  "std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processSourceEseqInCMove(const IRT::CExpression *, const IRT::CEseqExpression *)"
                 );
  }
  pCVar4 = CEseqExpression::getStatement(eseq);
  bVar2 = isExpCommuteWithStm(&exp->super_CExpression,pCVar4);
  if (bVar2) {
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    pCVar4 = CEseqExpression::getStatement(eseq);
    (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(&local_48);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_40,&local_48);
    pCVar6 = (CMoveStatement *)operator_new(0x18);
    (*(sourceEseq_local->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_78)
    ;
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_70,&local_78);
    pCVar3 = CEseqExpression::getExpression(eseq);
    (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_80,&local_88);
    CMoveStatement::CMoveStatement(pCVar6,&local_70,&local_80);
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_68,(pointer)pCVar6);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (local_60,&local_68);
    CSeqStatement::CSeqStatement(pCVar5,&local_40,local_60);
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_38,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               this,&local_38);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_38);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (local_60);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_68);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_40);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_48);
  }
  else {
    if (sourceEseq_local == (CEseqExpression *)0x0) {
      local_230 = (CMemExpression *)0x0;
    }
    else {
      local_230 = (CMemExpression *)
                  __dynamic_cast(sourceEseq_local,&CExpression::typeinfo,&CMemExpression::typeinfo,0
                                );
    }
    if (sourceEseq_local == (CEseqExpression *)0x0) {
      local_240 = 0;
    }
    else {
      local_240 = __dynamic_cast(sourceEseq_local,&CExpression::typeinfo,&CTempExpression::typeinfo,
                                 0);
    }
    temp._24_8_ = local_240;
    if (local_230 == (CMemExpression *)0x0 && local_240 == 0) {
      __assert_fail("memTarget != nullptr || tempTarget != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CEseqFloatVisitor.cpp"
                    ,299,
                    "std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processSourceEseqInCMove(const IRT::CExpression *, const IRT::CEseqExpression *)"
                   );
    }
    if (local_230 == (CMemExpression *)0x0) {
      if (local_240 == 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      pCVar5 = (CSeqStatement *)operator_new(0x18);
      pCVar4 = CEseqExpression::getStatement(eseq);
      (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(&local_188);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_180,&local_188);
      pCVar6 = (CMoveStatement *)operator_new(0x18);
      (**(code **)(*(long *)temp._24_8_ + 0x18))(&local_1a8);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_1a0,&local_1a8);
      pCVar3 = CEseqExpression::getExpression(eseq);
      (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_1b8);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_1b0,&local_1b8);
      CMoveStatement::CMoveStatement(pCVar6,&local_1a0,&local_1b0);
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_198,(pointer)pCVar6);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_190,&local_198);
      CSeqStatement::CSeqStatement(pCVar5,&local_180,&local_190);
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_178,(pointer)pCVar5);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 this,&local_178);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_178);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_190);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_198);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_1b0);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_1b8);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_1a0);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_1a8);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_180);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_188);
    }
    else {
      CTemp::CTemp((CTemp *)local_c0);
      pCVar5 = (CSeqStatement *)operator_new(0x18);
      local_16b = 1;
      pCVar6 = (CMoveStatement *)operator_new(0x18);
      local_f9 = 1;
      pCVar7 = (CTempExpression *)operator_new(0x28);
      CTempExpression::CTempExpression(pCVar7,(CTemp *)local_c0);
      std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
      unique_ptr<std::default_delete<IRT::CExpression_const>,void>
                ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
                 &local_e8,(pointer)pCVar7);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_e0,&local_e8);
      pCVar3 = CMemExpression::getAddress(local_230);
      (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_f8);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_f0,&local_f8);
      CMoveStatement::CMoveStatement(pCVar6,&local_e0,&local_f0);
      local_f9 = 0;
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_d8,(pointer)pCVar6);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_d0,&local_d8);
      this_00 = (CSeqStatement *)operator_new(0x18);
      local_16a = 1;
      pCVar4 = CEseqExpression::getStatement(eseq);
      (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(&local_120);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_118,&local_120);
      pCVar6 = (CMoveStatement *)operator_new(0x18);
      local_169 = 1;
      this_01 = (CMemExpression *)operator_new(0x10);
      local_151 = 1;
      pCVar7 = (CTempExpression *)operator_new(0x28);
      CTempExpression::CTempExpression(pCVar7,(CTemp *)local_c0);
      std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
      unique_ptr<std::default_delete<IRT::CExpression_const>,void>
                ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
                 &local_150,(pointer)pCVar7);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_148,&local_150);
      CMemExpression::CMemExpression(this_01,&local_148);
      local_151 = 0;
      std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
      unique_ptr<std::default_delete<IRT::CExpression_const>,void>
                ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
                 &local_140,(pointer)this_01);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_138,&local_140);
      pCVar3 = CEseqExpression::getExpression(eseq);
      (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(&local_168);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      unique_ptr(&local_160,&local_168);
      CMoveStatement::CMoveStatement(pCVar6,&local_138,&local_160);
      local_169 = 0;
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_130,(pointer)pCVar6);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_128,&local_130);
      CSeqStatement::CSeqStatement(this_00,&local_118,&local_128);
      local_16a = 0;
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_110,(pointer)this_00);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_108,&local_110);
      CSeqStatement::CSeqStatement(pCVar5,&local_d0,&local_108);
      local_16b = 0;
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_c8,(pointer)pCVar5);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 this,&local_c8);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_c8);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_108);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_110);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_128);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_130);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_160);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_168);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_138);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_140);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_148);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_150);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_118);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_120);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_d0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_d8);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_f0);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_f8);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_e0);
      std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
      ~unique_ptr(&local_e8);
      CTemp::~CTemp((CTemp *)local_c0);
    }
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processSourceEseqInCMove(
        const IRT::CExpression *target, const IRT::CEseqExpression *sourceEseq) {

    const CEseqExpression* eseq = dynamic_cast<const CEseqExpression*>(sourceEseq->getExpression());
    assert(eseq == nullptr);

    if (isExpCommuteWithStm(target, sourceEseq->getStatement())) {
        return SMOVE_UNIQ(new CSeqStatement(
                std::move(sourceEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CMoveStatement(
                        std::move(target->Copy()),
                        std::move(sourceEseq->getExpression()->Copy())
                ))
        ));
    } else {

        const CMemExpression* memTarget = dynamic_cast<const CMemExpression*>(target);
        const CTempExpression* tempTarget = dynamic_cast<const CTempExpression*>(target);

        assert(memTarget != nullptr || tempTarget != nullptr);

        if (memTarget != nullptr) {
            CTemp temp;

            return SMOVE_UNIQ(new CSeqStatement(
                    SMOVE_UNIQ(new CMoveStatement(
                            EMOVE_UNIQ(new CTempExpression(temp)),
                            std::move(memTarget->getAddress()->Copy())
                    )),
                    SMOVE_UNIQ(new CSeqStatement(
                            std::move(sourceEseq->getStatement()->Copy()),
                            SMOVE_UNIQ(new CMoveStatement(
                                    EMOVE_UNIQ(new CMemExpression(EMOVE_UNIQ(new CTempExpression(temp)))),
                                    std::move(sourceEseq->getExpression()->Copy())
                            ))
                    ))
            ));
        }

        if (tempTarget != nullptr) {
            return SMOVE_UNIQ(new CSeqStatement(
                            std::move(sourceEseq->getStatement()->Copy()),
                            SMOVE_UNIQ(new CMoveStatement(
                                    EMOVE_UNIQ(tempTarget->Copy()),
                                    std::move(sourceEseq->getExpression()->Copy())
                            ))
            ));
        }
    }
}